

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O3

bool __thiscall SVGChart::PPlot::CalculateTickInfo(PPlot *this,PRect *inRect,Painter *inPainter)

{
  float fVar1;
  int iVar2;
  undefined4 extraout_var;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar5 = (this->mXAxisSetup).mMax - (this->mXAxisSetup).mMin;
  if (fVar5 <= 0.0) {
    return false;
  }
  fVar4 = (this->mYAxisSetup).mMin;
  fVar1 = (this->mYAxisSetup).mMax;
  fVar6 = fVar1 - fVar4;
  if (fVar6 < 0.0) {
    return false;
  }
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    if ((ABS(fVar6 / fVar1) < 0.001) || ((fVar6 == 0.0 && (!NAN(fVar6))))) {
      fVar6 = ABS(fVar1) * 0.1;
      goto LAB_00107b90;
    }
  }
  else if ((fVar6 == 0.0) && (!NAN(fVar6))) {
    fVar6 = 0.1;
LAB_00107b90:
    (this->mYAxisSetup).mMax = fVar1 + fVar6;
    fVar4 = fVar4 - fVar6;
    (this->mYAxisSetup).mMin = fVar4;
    fVar6 = (fVar1 + fVar6) - fVar4;
  }
  if ((this->mXAxisSetup).mTickInfo.mAutoTick == true) {
    iVar2 = (*inPainter->_vptr_Painter[8])(inPainter,"12345");
    iVar2 = (*this->mXTickIterator->_vptr_TickIterator[4])
                      (fVar5,(float)inRect->mH,(float)inRect->mW / ((float)iVar2 + (float)iVar2),
                       this->mXTickIterator,&(this->mXAxisSetup).mTickInfo);
    if ((char)iVar2 != '\0') goto LAB_00107c1e;
LAB_00107d6c:
    bVar3 = false;
  }
  else {
LAB_00107c1e:
    if ((this->mYAxisSetup).mTickInfo.mAutoTick == true) {
      iVar2 = (*inPainter->_vptr_Painter[9])(inPainter);
      iVar2 = (*this->mYTickIterator->_vptr_TickIterator[4])
                        (fVar6,(float)inRect->mW,
                         (float)inRect->mH / ((float)CONCAT44(extraout_var,iVar2) * 3.0),
                         this->mYTickIterator,&(this->mYAxisSetup).mTickInfo);
      if ((char)iVar2 == '\0') goto LAB_00107d6c;
    }
    iVar2 = (*inPainter->_vptr_Painter[9])(inPainter);
    if ((this->mXAxisSetup).mTickInfo.mAutoTickSize == true) {
      fVar4 = floorf((float)iVar2 * 0.5 + 0.5);
      fVar5 = (float)(this->mXAxisSetup).mTickInfo.mMajorTickScreenSize;
      if ((float)(int)fVar4 < fVar5) {
        (this->mXAxisSetup).mTickInfo.mMajorTickScreenSize = (int)fVar4;
        fVar5 = (float)(int)fVar4;
      }
      fVar5 = floorf(fVar5 * 0.5 + 0.5);
      (this->mXAxisSetup).mTickInfo.mMinorTickScreenSize = (int)fVar5;
    }
    iVar2 = (*inPainter->_vptr_Painter[9])(inPainter);
    bVar3 = true;
    if ((this->mYAxisSetup).mTickInfo.mAutoTickSize == true) {
      fVar4 = floorf((float)iVar2 * 0.5 + 0.5);
      fVar5 = (float)(this->mYAxisSetup).mTickInfo.mMajorTickScreenSize;
      if ((float)(int)fVar4 < fVar5) {
        (this->mYAxisSetup).mTickInfo.mMajorTickScreenSize = (int)fVar4;
        fVar5 = (float)(int)fVar4;
      }
      fVar5 = floorf(fVar5 * 0.5 + 0.5);
      (this->mYAxisSetup).mTickInfo.mMinorTickScreenSize = (int)fVar5;
    }
  }
  return bVar3;
}

Assistant:

bool PPlot::CalculateTickInfo (const PRect &inRect, Painter &inPainter) {
      float theXRange = mXAxisSetup.mMax - mXAxisSetup.mMin;
      float theYRange = mYAxisSetup.mMax - mYAxisSetup.mMin;

      if (theXRange <= 0 || theYRange < 0) {
        return false;
      }

      if ((mYAxisSetup.mMax != 0 && fabs (theYRange / mYAxisSetup.mMax) < kRangeVerySmall) ||
        theYRange == 0) {
        float delta = 0.1f;
        if (mYAxisSetup.mMax != 0) {
            delta *= fabs(mYAxisSetup.mMax);
        }
        
        mYAxisSetup.mMax += delta;
        mYAxisSetup.mMin -= delta;
        theYRange = mYAxisSetup.mMax - mYAxisSetup.mMin;
      }

      if (mXAxisSetup.mTickInfo.mAutoTick) {
        int theTextWidth = inPainter.CalculateTextDrawSize ("12345");
        float theDivGuess = inRect.mW/(kMajorTickXInitialFac*theTextWidth);
        if (!mXTickIterator->InitFromRanges (theXRange, inRect.mH, theDivGuess, mXAxisSetup.mTickInfo)) {
          return false;
        }
      }
      if (mYAxisSetup.mTickInfo.mAutoTick) {
        float theTextHeight = inPainter.GetFontHeight ();
        float theDivGuess = inRect.mH/(kMajorTickYInitialFac*theTextHeight);
        if (!mYTickIterator->InitFromRanges (theYRange, inRect.mW, theDivGuess, mYAxisSetup.mTickInfo)) {
          return false;
        }
      }

      SetTickSizes (inPainter.GetFontHeight (), mXAxisSetup.mTickInfo);
      SetTickSizes (inPainter.GetFontHeight (), mYAxisSetup.mTickInfo);

      return true;
    }